

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O1

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:893:61)>_>
::_on_pipe(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
           *this,Pipeflow *pf,Runtime *param_2)

{
  size_t sVar1;
  size_t *psVar2;
  atomic<unsigned_long> *paVar3;
  pthread_mutex_t *ppVar4;
  vector<int,std::allocator<int>> *pvVar5;
  iterator iVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  code *pcVar8;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  bool bVar9;
  char extraout_AL_04;
  int iVar10;
  variant_alternative_t<0UL,_variant<int,_monostate>_> *pvVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double dVar12;
  ResultBuilder DOCTEST_RB;
  int local_e4;
  Result local_e0;
  ResultBuilder local_c0;
  size_t local_48;
  Expression_lhs<const_unsigned_long_&> local_40;
  
  sVar1 = pf->_pipe;
  if (sVar1 == 2) {
    pvVar11 = std::get<0ul,int,std::monostate>
                        (&(this->_buffer).
                          super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_e4 = *pvVar11;
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x37e;
    local_c0.super_AssertData.m_expr = "j3++ < N";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    paVar3 = *(atomic<unsigned_long> **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>,_false>
                      ._M_head_impl._callable + 8);
    LOCK();
    local_40.lhs = (unsigned_long *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
    (paVar3->super___atomic_base<unsigned_long>)._M_i =
         (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long>::operator<<unsigned_long,_nullptr>
              (&local_e0,(Expression_lhs<const_unsigned_long> *)&local_40,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                .
                super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                .
                super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar12 = extraout_XMM0_Qa_03;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar12 = extraout_XMM0_Qa_04;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar12);
    if (extraout_AL_01 != '\0') {
      pcVar8 = (code *)swi(3);
      (*pcVar8)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar9 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar9)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    ppVar4 = *(pthread_mutex_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>,_false>
                      ._M_head_impl._callable + 0x10);
    iVar10 = pthread_mutex_lock(ppVar4);
    if (iVar10 != 0) {
LAB_0013e15b:
      std::__throw_system_error(iVar10);
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x381;
    local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>,_false>
                            ._M_head_impl._callable + 0x20));
    local_40.m_at = DT_REQUIRE;
    local_48 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_48);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar12 = extraout_XMM0_Qa_05;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar12 = extraout_XMM0_Qa_06;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar12);
    if (extraout_AL_02 != '\0') {
      pcVar8 = (code *)swi(3);
      (*pcVar8)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar9 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar9)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    pvVar5 = *(vector<int,std::allocator<int>> **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                      .
                      super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>,_false>
                      ._M_head_impl._callable + 0x18);
    iVar6._M_current = *(int **)(pvVar5 + 8);
    if (iVar6._M_current == *(int **)(pvVar5 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar5,iVar6,&local_e4);
    }
    else {
      *iVar6._M_current = local_e4;
      *(int **)(pvVar5 + 8) = iVar6._M_current + 1;
    }
    pthread_mutex_unlock(ppVar4);
  }
  else {
    if (sVar1 == 1) {
      pvVar11 = std::get<0ul,int,std::monostate>
                          (&(this->_buffer).
                            super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
      local_e4 = *pvVar11;
      local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_c0.super_AssertData.m_at = DT_REQUIRE;
      local_c0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c0.super_AssertData.m_line = 0x372;
      local_c0.super_AssertData.m_expr = "j2++ < N";
      local_c0.super_AssertData.m_failed = true;
      local_c0.super_AssertData.m_threw = false;
      local_c0.super_AssertData.m_threw_as = false;
      local_c0.super_AssertData.m_exception_type = "";
      local_c0.super_AssertData.m_exception_string = "";
      paVar3 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
               .
               super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_false>
               ._M_head_impl._callable.j2;
      LOCK();
      local_40.lhs = (unsigned_long *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_40.m_at = DT_REQUIRE;
      doctest::detail::Expression_lhs<const_unsigned_long>::operator<<unsigned_long,_nullptr>
                (&local_e0,(Expression_lhs<const_unsigned_long> *)&local_40,
                 &(this->_pipes).
                  super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                  .
                  super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                  .
                  super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_false>
                  ._M_head_impl._callable.N);
      doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_c0.super_AssertData._40_2_ =
           CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar12 = extraout_XMM0_Qa;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar12 = extraout_XMM0_Qa_00;
      }
      doctest::detail::ResultBuilder::log(&local_c0,dVar12);
      if (extraout_AL != '\0') {
        pcVar8 = (code *)swi(3);
        (*pcVar8)();
        return;
      }
      if ((local_c0.super_AssertData.m_failed == true) &&
         (bVar9 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar9)) {
        doctest::detail::throwException();
      }
      if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                           local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_c0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                           local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                           local_c0.super_AssertData.m_exception.field_0.buf[0]));
      }
      ppVar4 = (pthread_mutex_t *)
               (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
               .
               super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_false>
               ._M_head_impl._callable.mutex2;
      iVar10 = pthread_mutex_lock(ppVar4);
      if (iVar10 != 0) goto LAB_0013e15b;
      local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_c0.super_AssertData.m_at = DT_REQUIRE;
      local_c0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c0.super_AssertData.m_line = 0x376;
      local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
      local_c0.super_AssertData.m_failed = true;
      local_c0.super_AssertData.m_threw = false;
      local_c0.super_AssertData.m_threw_as = false;
      local_c0.super_AssertData.m_exception_type = "";
      local_c0.super_AssertData.m_exception_string = "";
      local_40.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                     .
                     super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                     .
                     super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_false>
                     ._M_head_impl._callable.L);
      local_40.m_at = DT_REQUIRE;
      local_48 = pf->_line;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_48);
      doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_c0.super_AssertData._40_2_ =
           CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar12 = extraout_XMM0_Qa_01;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar12 = extraout_XMM0_Qa_02;
      }
      doctest::detail::ResultBuilder::log(&local_c0,dVar12);
      if (extraout_AL_00 != '\0') {
        pcVar8 = (code *)swi(3);
        (*pcVar8)();
        return;
      }
      if ((local_c0.super_AssertData.m_failed == true) &&
         (bVar9 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar9)) {
        doctest::detail::throwException();
      }
      if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                           local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_c0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                           local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                           local_c0.super_AssertData.m_exception.field_0.buf[0]));
      }
      pvVar5 = (vector<int,std::allocator<int>> *)
               (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
               .
               super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_false>
               ._M_head_impl._callable.collection2;
      iVar6._M_current = *(int **)(pvVar5 + 8);
      if (iVar6._M_current == *(int **)(pvVar5 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar5,iVar6,&local_e4);
      }
      else {
        *iVar6._M_current = local_e4;
        *(int **)(pvVar5 + 8) = iVar6._M_current + 1;
      }
      iVar10 = local_e4 + 1;
      pthread_mutex_unlock(ppVar4);
      local_c0.super_AssertData.m_test_case =
           (TestCaseData *)CONCAT44(local_c0.super_AssertData.m_test_case._4_4_,iVar10);
    }
    else {
      if (sVar1 != 0) {
        return;
      }
      psVar2 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_false>
               ._M_head_impl._callable.j1;
      if (*psVar2 ==
          (this->_pipes).
          super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
          .
          super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_false>
          ._M_head_impl._callable.N) {
        pf->_stop = true;
        iVar10 = 0;
      }
      else {
        local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_c0.super_AssertData.m_at = DT_REQUIRE;
        local_c0.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
        ;
        local_c0.super_AssertData.m_line = 0x369;
        local_c0.super_AssertData.m_expr = "j1 == source[j1]";
        local_c0.super_AssertData.m_failed = true;
        local_c0.super_AssertData.m_threw = false;
        local_c0.super_AssertData.m_threw_as = false;
        local_c0.super_AssertData.m_exception_type = "";
        local_c0.super_AssertData.m_exception_string = "";
        local_40.m_at = DT_REQUIRE;
        local_40.lhs = psVar2;
        doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                  (&local_e0,&local_40,
                   (((this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                     .
                     super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_false>
                     ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>)
                   ._M_impl.super__Vector_impl_data._M_start + *psVar2);
        doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
        local_c0.super_AssertData._40_2_ =
             CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
        dVar12 = extraout_XMM0_Qa_07;
        if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_e0.m_decomp.field_0.data.ptr);
          dVar12 = extraout_XMM0_Qa_08;
        }
        doctest::detail::ResultBuilder::log(&local_c0,dVar12);
        if (extraout_AL_03 != '\0') {
          pcVar8 = (code *)swi(3);
          (*pcVar8)();
          return;
        }
        if ((local_c0.super_AssertData.m_failed == true) &&
           (bVar9 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar9)) {
          doctest::detail::throwException();
        }
        if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                             local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                             local_c0.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                             local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                             local_c0.super_AssertData.m_exception.field_0.buf[0]));
        }
        local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_c0.super_AssertData.m_at = DT_REQUIRE;
        local_c0.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
        ;
        local_c0.super_AssertData.m_line = 0x36a;
        local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
        local_c0.super_AssertData.m_failed = true;
        local_c0.super_AssertData.m_threw = false;
        local_c0.super_AssertData.m_threw_as = false;
        local_c0.super_AssertData.m_exception_type = "";
        local_c0.super_AssertData.m_exception_string = "";
        local_40.lhs = (unsigned_long *)
                       (pf->_token %
                       (this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                       .
                       super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_false>
                       ._M_head_impl._callable.L);
        local_40.m_at = DT_REQUIRE;
        local_48 = pf->_line;
        doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                  (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_48);
        doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
        local_c0.super_AssertData._40_2_ =
             CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
        dVar12 = extraout_XMM0_Qa_09;
        if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_e0.m_decomp.field_0.data.ptr);
          dVar12 = extraout_XMM0_Qa_10;
        }
        doctest::detail::ResultBuilder::log(&local_c0,dVar12);
        if (extraout_AL_04 != '\0') {
          pcVar8 = (code *)swi(3);
          (*pcVar8)();
          return;
        }
        if ((local_c0.super_AssertData.m_failed == true) &&
           (bVar9 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar9)) {
          doctest::detail::throwException();
        }
        if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                             local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                             local_c0.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                             local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                             local_c0.super_AssertData.m_exception.field_0.buf[0]));
        }
        pvVar7 = (this->_pipes).
                 super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                 .
                 super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_false>
                 ._M_head_impl._callable.source;
        psVar2 = (this->_pipes).
                 super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:881:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:893:61)>_>
                 .
                 super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:868:68)>,_false>
                 ._M_head_impl._callable.j1;
        sVar1 = *psVar2;
        *psVar2 = sVar1 + 1;
        iVar10 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[sVar1] + 1;
      }
      local_c0.super_AssertData.m_test_case =
           (TestCaseData *)CONCAT44(local_c0.super_AssertData.m_test_case._4_4_,iVar10);
    }
    std::variant<int,std::monostate>::operator=
              ((variant<int,std::monostate> *)
               ((this->_buffer).
                super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + pf->_line),(int *)&local_c0);
  }
  return;
}

Assistant:

void DataPipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime&) {

  visit_tuple([&](auto&& pipe){

    using data_pipe_t = std::decay_t<decltype(pipe)>;
    using callable_t  = typename data_pipe_t::callable_t;
    using input_t     = std::decay_t<typename data_pipe_t::input_t>;
    using output_t    = std::decay_t<typename data_pipe_t::output_t>;
    
    // first pipe
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      // [](tf::Pipeflow&) -> void {}, i.e., we only have one pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(pf);
      // [](tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(pf);
      }
    }
    // other pipes without pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, std::add_lvalue_reference_t<input_t> >) {
      // [](input_t&) -> void {}, i.e., the last pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data));
      // [](input_t&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data)
        );
      }
    }
    // other pipes with pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, input_t&, Pipeflow&>) {
      // [](input_t&, tf::Pipeflow&) -> void {}
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data), pf);
      // [](input_t&, tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data), pf
        );
      }
    }
    //else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
    //  pipe._callable(pf, rt);
    //}
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}